

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O0

handle pybind11::detail::list_caster<std::vector<double,std::allocator<double>>,double>::
       cast<std::vector<double,std::allocator<double>>>
                 (vector<double,_std::allocator<double>_> *src,return_value_policy policy,
                 handle parent)

{
  PyObject *pPVar1;
  bool bVar2;
  int iVar3;
  size_type size;
  forwarded_type<std::vector<double>,_double_&> pdVar4;
  PyObject **ppPVar5;
  handle local_90;
  int local_84;
  PyObject *local_80;
  PyObject *local_68;
  handle local_60;
  object value_;
  double *value;
  iterator __end0;
  iterator __begin0;
  vector<double,_std::allocator<double>_> *__range3;
  size_t index;
  list l;
  return_value_policy policy_local;
  vector<double,_std::allocator<double>_> *src_local;
  handle parent_local;
  
  l.super_object.super_handle.m_ptr._7_1_ = policy;
  l.super_object.super_handle.m_ptr._7_1_ =
       return_value_policy_override<double,_void>::policy(policy);
  size = std::vector<double,_std::allocator<double>_>::size(src);
  list::list((list *)&index,size);
  __range3 = (vector<double,_std::allocator<double>_> *)0x0;
  __end0 = std::vector<double,_std::allocator<double>_>::begin(src);
  value = (double *)std::vector<double,_std::allocator<double>_>::end(src);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)&value);
    if (!bVar2) break;
    value_.super_handle.m_ptr =
         (handle)__gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator*(&__end0);
    pdVar4 = forward_like<std::vector<double,std::allocator<double>>,double&>
                       ((double *)value_.super_handle.m_ptr);
    local_80 = parent.m_ptr;
    local_68 = (PyObject *)
               type_caster<double,_void>::cast<double>
                         (*pdVar4,l.super_object.super_handle.m_ptr._7_1_,parent);
    reinterpret_steal<pybind11::object>((pybind11 *)&local_60,(handle)local_68);
    bVar2 = handle::operator_cast_to_bool(&local_60);
    if (bVar2) {
      local_90 = object::release((object *)&local_60);
      ppPVar5 = handle::ptr(&local_90);
      pPVar1 = *ppPVar5;
      ppPVar5 = handle::ptr((handle *)&index);
      iVar3 = PyType_HasFeature((*ppPVar5)->ob_type,0x2000000);
      if (iVar3 == 0) {
        __assert_fail("PyList_Check(l.ptr())",
                      "/workspace/llm4binary/github/license_c_cmakelists/yijiangh[P]ikfast_pybind/ext/pybind11/include/pybind11/stl.h"
                      ,0xb2,
                      "static handle pybind11::detail::list_caster<std::vector<double>, double>::cast(T &&, return_value_policy, handle) [Type = std::vector<double>, Value = double, T = std::vector<double>]"
                     );
      }
      ppPVar5 = handle::ptr((handle *)&index);
      (&(((*ppPVar5)[1].ob_type)->ob_base).ob_base.ob_refcnt)[(long)__range3] = (Py_ssize_t)pPVar1;
      local_84 = 0;
      __range3 = (vector<double,_std::allocator<double>_> *)
                 ((long)&(__range3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + 1);
    }
    else {
      memset(&parent_local,0,8);
      handle::handle(&parent_local);
      local_84 = 1;
    }
    object::~object((object *)&local_60);
    if (local_84 != 0) goto LAB_001434f6;
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end0);
  }
  parent_local = object::release((object *)&index);
  local_84 = 1;
LAB_001434f6:
  list::~list((list *)&index);
  return (handle)parent_local.m_ptr;
}

Assistant:

static handle cast(T &&src, return_value_policy policy, handle parent) {
        if (!std::is_lvalue_reference<T>::value)
            policy = return_value_policy_override<Value>::policy(policy);
        list l(src.size());
        size_t index = 0;
        for (auto &&value : src) {
            auto value_ = reinterpret_steal<object>(value_conv::cast(forward_like<T>(value), policy, parent));
            if (!value_)
                return handle();
            PyList_SET_ITEM(l.ptr(), (ssize_t) index++, value_.release().ptr()); // steals a reference
        }
        return l.release();
    }